

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroCmd.cpp
# Opt level: O2

void reset_group_input_file(gengetopt_args_info *args_info)

{
  if (args_info->input_file_group_counter != 0) {
    args_info->input_given = 0;
    free_string_field(&args_info->input_arg);
    free_string_field(&args_info->input_orig);
    args_info->xyz_given = 0;
    free_string_field(&args_info->xyz_arg);
    free_string_field(&args_info->xyz_orig);
    args_info->stl_given = 0;
    free_string_field(&args_info->stl_arg);
    free_string_field(&args_info->stl_orig);
    args_info->msms_given = 0;
    free_string_field(&args_info->msms_arg);
    free_string_field(&args_info->msms_orig);
    args_info->input_file_group_counter = 0;
  }
  return;
}

Assistant:

static void
reset_group_input_file(struct gengetopt_args_info *args_info)
{
  if (! args_info->input_file_group_counter)
    return;
  
  args_info->input_given = 0 ;
  free_string_field (&(args_info->input_arg));
  free_string_field (&(args_info->input_orig));
  args_info->xyz_given = 0 ;
  free_string_field (&(args_info->xyz_arg));
  free_string_field (&(args_info->xyz_orig));
  args_info->stl_given = 0 ;
  free_string_field (&(args_info->stl_arg));
  free_string_field (&(args_info->stl_orig));
  args_info->msms_given = 0 ;
  free_string_field (&(args_info->msms_arg));
  free_string_field (&(args_info->msms_orig));

  args_info->input_file_group_counter = 0;
}